

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBblif.c
# Opt level: O2

Abc_Ntk_t * Bbl_ManToAig(Bbl_Man_t *p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  void *__ptr;
  Bbl_Obj_t *pBVar4;
  char *pcVar5;
  Dec_Graph_t *pDVar6;
  Abc_Ntk_t *pNtk;
  char *pcVar7;
  Vec_Ptr_t *p_00;
  Abc_Obj_t *pAVar8;
  Vec_Ptr_t *p_01;
  Vec_Ptr_t *p_02;
  Bbl_Obj_t *pBVar9;
  void *pvVar10;
  Abc_Obj_t *pObj;
  ulong uVar11;
  int i;
  
  Abc_Clock();
  iVar1 = Bbl_ManFncSize(p);
  __ptr = calloc((long)iVar1,8);
  for (pBVar4 = Bbl_ManObjFirst(p); pBVar4 != (Bbl_Obj_t *)0x0; pBVar4 = Bbl_ManObjNext(p,pBVar4)) {
    iVar1 = Bbl_ObjFncHandle(pBVar4);
    if (*(long *)((long)__ptr + (long)iVar1 * 8) == 0) {
      pcVar5 = Bbl_ObjSop(p,pBVar4);
      pDVar6 = Dec_Factor(pcVar5);
      iVar1 = Bbl_ObjFncHandle(pBVar4);
      *(Dec_Graph_t **)((long)__ptr + (long)iVar1 * 8) = pDVar6;
    }
  }
  pNtk = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
  pcVar5 = Bbl_ManName(p);
  pcVar7 = Extra_UtilStrsav(pcVar5);
  pNtk->pName = pcVar7;
  p_00 = Vec_PtrStart((int)pcVar5);
  for (pBVar4 = Bbl_ManObjFirst(p); pBVar4 != (Bbl_Obj_t *)0x0; pBVar4 = Bbl_ManObjNext(p,pBVar4)) {
    iVar1 = Bbl_ObjIsInput(pBVar4);
    if (iVar1 != 0) {
      iVar1 = Bbl_ObjId(pBVar4);
      pAVar8 = Abc_NtkCreatePi(pNtk);
      Vec_PtrSetEntry(p_00,iVar1,pAVar8);
    }
  }
  Abc_Clock();
  p_01 = Bbl_ManDfs(p);
  p_02 = Vec_PtrAlloc(100);
  iVar1 = p_01->nSize;
  for (i = 0; i < iVar1; i = i + 1) {
    pBVar4 = (Bbl_Obj_t *)Vec_PtrEntry(p_01,i);
    p_02->nSize = 0;
    for (pBVar9 = Bbl_ObjFaninFirst(pBVar4); pBVar9 != (Bbl_Obj_t *)0x0;
        pBVar9 = Bbl_ObjFaninNext(pBVar4,pBVar9)) {
      iVar2 = Bbl_ObjId(pBVar9);
      pvVar10 = Vec_PtrEntry(p_00,iVar2);
      Vec_PtrPush(p_02,pvVar10);
    }
    iVar2 = Bbl_ObjFncHandle(pBVar4);
    pAVar8 = Dec_GraphToAig(pNtk,*(Dec_Graph_t **)((long)__ptr + (long)iVar2 * 8),p_02);
    iVar2 = Bbl_ObjId(pBVar4);
    Vec_PtrSetEntry(p_00,iVar2,pAVar8);
  }
  Vec_PtrFree(p_02);
  Vec_PtrFree(p_01);
  for (pBVar4 = Bbl_ManObjFirst(p); pBVar4 != (Bbl_Obj_t *)0x0; pBVar4 = Bbl_ManObjNext(p,pBVar4)) {
    iVar1 = Bbl_ObjIsOutput(pBVar4);
    if (iVar1 != 0) {
      pBVar9 = Bbl_ObjFaninFirst(pBVar4);
      iVar1 = Bbl_ObjId(pBVar9);
      pAVar8 = (Abc_Obj_t *)Vec_PtrEntry(p_00,iVar1);
      pObj = Abc_NtkCreatePo(pNtk);
      Abc_ObjAddFanin(pObj,pAVar8);
    }
  }
  Abc_AigCleanup((Abc_Aig_t *)pNtk->pManFunc);
  uVar3 = Bbl_ManFncSize(p);
  for (uVar11 = (ulong)uVar3; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
    pvVar10 = *(void **)((long)__ptr + uVar11 * 8 + -8);
    if (pvVar10 != (void *)0x0) {
      free(*(void **)((long)pvVar10 + 0x10));
      free(pvVar10);
    }
  }
  free(__ptr);
  Abc_Clock();
  Vec_PtrFree(p_00);
  Abc_NtkAddDummyPiNames(pNtk);
  Abc_NtkAddDummyPoNames(pNtk);
  return pNtk;
}

Assistant:

Abc_Ntk_t * Bbl_ManToAig( Bbl_Man_t * p )
{
    extern int Bbl_ManFncSize( Bbl_Man_t * p );
    extern int Bbl_ObjFncHandle( Bbl_Obj_t * p );
    extern Abc_Obj_t * Dec_GraphToAig( Abc_Ntk_t * pNtk, Dec_Graph_t * pFForm, Vec_Ptr_t * vFaninAigs );
    int fVerbose = 0;
    Abc_Ntk_t * pNtk;
    Abc_Obj_t * pObjNew = NULL;
    Bbl_Obj_t * pObj, * pFanin;
    Vec_Ptr_t * vCopy, * vNodes, * vFaninAigs;
    Dec_Graph_t ** pFForms;
    int i;
    abctime clk;
clk = Abc_Clock();
    // map SOP handles into factored forms
    pFForms = ABC_CALLOC( Dec_Graph_t *, Bbl_ManFncSize(p) );
    Bbl_ManForEachObj( p, pObj )
        if ( pFForms[Bbl_ObjFncHandle(pObj)] == NULL )
            pFForms[Bbl_ObjFncHandle(pObj)] = Dec_Factor( Bbl_ObjSop(p, pObj) );
if ( fVerbose )
ABC_PRT( "Fct", Abc_Clock() - clk );
    // start the network
    pNtk = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    pNtk->pName = Extra_UtilStrsav( Bbl_ManName(p) );
    vCopy = Vec_PtrStart( 1000 );
    // create CIs
    Bbl_ManForEachObj( p, pObj )
    {
        if ( !Bbl_ObjIsInput(pObj) )
            continue;
        Vec_PtrSetEntry( vCopy, Bbl_ObjId(pObj), Abc_NtkCreatePi(pNtk) );
    }
clk = Abc_Clock();
    // create internal nodes
    vNodes = Bbl_ManDfs( p );
    vFaninAigs = Vec_PtrAlloc( 100 );
    Vec_PtrForEachEntry( Bbl_Obj_t *, vNodes, pObj, i )
    {
        // collect fanin AIGs
        Vec_PtrClear( vFaninAigs );
        Bbl_ObjForEachFanin( pObj, pFanin )
            Vec_PtrPush( vFaninAigs, Vec_PtrEntry( vCopy, Bbl_ObjId(pFanin) ) );
        // create the new node
        pObjNew = Dec_GraphToAig( pNtk, pFForms[Bbl_ObjFncHandle(pObj)], vFaninAigs );
        Vec_PtrSetEntry( vCopy, Bbl_ObjId(pObj), pObjNew );
    }
    Vec_PtrFree( vFaninAigs );
    Vec_PtrFree( vNodes );
if ( fVerbose )
ABC_PRT( "AIG", Abc_Clock() - clk );
    // create COs
    Bbl_ManForEachObj( p, pObj )
    {
        if ( !Bbl_ObjIsOutput(pObj) )
            continue;
        pObjNew = (Abc_Obj_t *)Vec_PtrEntry( vCopy, Bbl_ObjId(Bbl_ObjFaninFirst(pObj)) );
        Abc_ObjAddFanin( Abc_NtkCreatePo(pNtk), pObjNew );
    }
    Abc_AigCleanup( (Abc_Aig_t *)pNtk->pManFunc );
    // clear factored forms
    for ( i = Bbl_ManFncSize(p) - 1; i >= 0; i-- )
        if ( pFForms[i] )
            Dec_GraphFree( pFForms[i] );
    ABC_FREE( pFForms );
    // finalize
clk = Abc_Clock();
    Vec_PtrFree( vCopy );
    Abc_NtkAddDummyPiNames( pNtk );
    Abc_NtkAddDummyPoNames( pNtk );
if ( fVerbose )
ABC_PRT( "Nam", Abc_Clock() - clk );
//    if ( !Abc_NtkCheck( pNtk ) )
//        printf( "Bbl_ManToAig(): Network check has failed.\n" );
    return pNtk;
}